

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

QList<int> * __thiscall
QAccessibleTable::selectedColumns(QList<int> *__return_storage_ptr__,QAccessibleTable *this)

{
  QAbstractItemView *pQVar1;
  QItemSelectionModel *pQVar2;
  QModelIndexList *__range1;
  QModelIndex *index;
  QModelIndex *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QAbstractItemView *)view(this);
  pQVar2 = QAbstractItemView::selectionModel(pQVar1);
  if (pQVar2 == (QItemSelectionModel *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (int *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (QAbstractItemView *)view(this);
    QAbstractItemView::selectionModel(pQVar1);
    QItemSelectionModel::selectedColumns((int)&local_38);
    QList<int>::reserve(__return_storage_ptr__,local_38.size);
    pQVar3 = local_38.ptr;
    for (lVar4 = local_38.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
      QList<int>::append(__return_storage_ptr__,pQVar3->c);
      pQVar3 = pQVar3 + 1;
    }
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QAccessibleTable::selectedColumns() const
{
    if (!view()->selectionModel())
        return QList<int>();
    QList<int> columns;
    const QModelIndexList selectedColumns = view()->selectionModel()->selectedColumns();
    columns.reserve(selectedColumns.size());
    for (const QModelIndex &index : selectedColumns)
        columns.append(index.column());

    return columns;
}